

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::SnapshotEventLogEntry_UnloadSnapshot(EventLogEntry *evt)

{
  SnapShot *this;
  
  if (evt->EventKind == SnapshotTag) {
    this = (SnapShot *)evt[1].EventTimeStamp;
    if (this != (SnapShot *)0x0) {
      SnapShot::~SnapShot(this);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this,0x1f8);
      evt[1].EventTimeStamp = 0;
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void SnapshotEventLogEntry_UnloadSnapshot(EventLogEntry* evt)
        {
            SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            if(snapEvt->Snap != nullptr)
            {
                TT_HEAP_DELETE(SnapShot, snapEvt->Snap);
                snapEvt->Snap = nullptr;
            }
        }